

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O3

void __thiscall read_glow_v5::operator()(read_glow_v5 *this,glow_data **_glow,xr_reader *r)

{
  float *pfVar1;
  glow_data *pgVar2;
  
  pgVar2 = (glow_data *)operator_new(0x14);
  *_glow = pgVar2;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (pgVar2->position).field_0.field_0.x = *pfVar1;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 2);
  (pgVar2->position).field_0.field_0.y = pfVar1[1];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 3);
  (pgVar2->position).field_0.field_0.z = pfVar1[2];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 4);
  pgVar2->radius = pfVar1[3];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 5);
  pgVar2->texture_id = *(uint16_t *)(pfVar1 + 4);
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 6);
  pgVar2->shader_id = *(uint16_t *)(pfVar1 + 5);
  return;
}

Assistant:

void operator()(glow_data*& _glow, xr_reader& r) const {
	glow_data* glow = new glow_data;
	_glow = glow;
	r.r_fvector3(glow->position);
	glow->radius = r.r_float();
	glow->texture_id = uint16_t(r.r_u32() & UINT16_MAX);
	glow->shader_id = uint16_t(r.r_u32() & UINT16_MAX);
}